

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  HistogramPair *pHVar1;
  VP8LHistogram **ppVVar2;
  VP8LHistogram **ppVVar3;
  VP8LHistogram *pVVar4;
  VP8LHistogram *pVVar5;
  uint32_t *__dest;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  ushort *puVar9;
  PixOrCopy *pPVar10;
  int tmp;
  int iVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  VP8LHistogramSet *set;
  long lVar16;
  void *__base;
  HistogramPair *pHVar17;
  int64_t iVar18;
  void *__dest_00;
  byte bVar19;
  bool bVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  short sVar24;
  uint uVar25;
  long lVar26;
  ushort *puVar27;
  ushort uVar28;
  ulong uVar29;
  HistogramPair *pHVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int64_t iVar38;
  ushort *__s;
  int iVar39;
  uint32_t uVar40;
  ulong uVar41;
  short sVar42;
  ushort uVar43;
  int iVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  int iVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  int iVar70;
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar73 [16];
  VP8LHistogram **histograms;
  anon_struct_4_2_be341b0f bin_info [64];
  VP8LHistogram **local_1a8;
  VP8LHistogram *local_1a0;
  ulong local_198;
  uint local_184;
  ulong local_180;
  HistoQueue local_178;
  ushort *local_168;
  VP8LHistogramSet *local_160;
  ulong local_158;
  ulong local_150;
  int local_144;
  HistogramPair *local_140;
  VP8LRefsCursor local_138 [11];
  
  local_180 = CONCAT44(local_180._4_4_,low_effort);
  bVar19 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    uVar22 = 1;
  }
  else {
    iVar21 = 1 << (bVar19 & 0x1f);
    uVar22 = (ulong)(((ysize + iVar21) - 1U >> (bVar19 & 0x1f)) *
                    ((xsize + iVar21) - 1U >> (bVar19 & 0x1f)));
  }
  iVar21 = (int)uVar22;
  set = VP8LAllocateHistogramSet(iVar21,cache_bits);
  uVar45 = 0x40;
  if ((int)local_180 != 0) {
    uVar45 = 4;
  }
  local_168 = (ushort *)WebPSafeMalloc((ulong)(uint)(iVar21 * 2),2);
  local_160 = set;
  if (local_168 == (ushort *)0x0 || set == (VP8LHistogramSet *)0x0) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    __s = local_168;
    goto LAB_00146422;
  }
  ppVVar2 = set->histograms;
  local_158 = uVar45;
  VP8LRefsCursorInit(local_138,refs);
  VP8LHistogramSetClear(set);
  if (local_138[0].cur_pos != (PixOrCopy *)0x0) {
    iVar44 = 0;
    iVar39 = 0;
    do {
      pPVar10 = local_138[0].cur_pos;
      VP8LHistogramAddSinglePixOrCopy
                (ppVVar2[(int)((iVar44 >> (bVar19 & 0x1f)) +
                              (iVar39 >> (bVar19 & 0x1f)) *
                              (((1 << (bVar19 & 0x1f)) + xsize) - 1U >> (bVar19 & 0x1f)))],
                 local_138[0].cur_pos,(_func_int_int_int *)0x0,0);
      for (iVar44 = (uint)pPVar10->len + iVar44; xsize <= iVar44; iVar44 = iVar44 - xsize) {
        iVar39 = iVar39 + 1;
      }
      local_138[0].cur_pos = local_138[0].cur_pos + 1;
      if (local_138[0].cur_pos == local_138[0].last_pos_) {
        VP8LRefsCursorNextBlock(local_138);
      }
    } while (local_138[0].cur_pos != (PixOrCopy *)0x0);
  }
  local_198 = uVar22;
  if (0 < local_160->max_size) {
    ppVVar2 = local_160->histograms;
    ppVVar3 = image_histo->histograms;
    uVar45 = 0;
    uVar40 = 0;
    do {
      pVVar4 = ppVVar2[uVar45];
      UpdateHistogramCost(pVVar4);
      if ((((pVVar4->is_used_[0] == '\0') && (pVVar4->is_used_[1] == '\0')) &&
          (pVVar4->is_used_[2] == '\0')) &&
         ((pVVar4->is_used_[3] == '\0' && (pVVar4->is_used_[4] == '\0')))) {
        image_histo->histograms[(int)uVar45] = (VP8LHistogram *)0x0;
        uVar25 = image_histo->size;
        if (0 < (int)uVar25 && uVar25 - 1 == (int)uVar45) {
          do {
            if (image_histo->histograms[(ulong)uVar25 - 1] != (VP8LHistogram *)0x0) break;
            image_histo->size = uVar25 - 1;
            bVar20 = 1 < (int)uVar25;
            uVar25 = uVar25 - 1;
          } while (bVar20);
        }
        local_198 = (ulong)((int)local_198 - 1);
        local_160->histograms[uVar45] = (VP8LHistogram *)0x0;
        uVar25 = local_160->size;
        uVar12 = 0xffffffff;
        if (0 < (int)uVar25 && uVar45 == uVar25 - 1) {
          do {
            if (local_160->histograms[(ulong)uVar25 - 1] != (VP8LHistogram *)0x0) break;
            local_160->size = uVar25 - 1;
            bVar20 = 1 < (int)uVar25;
            uVar25 = uVar25 - 1;
          } while (bVar20);
        }
      }
      else {
        pVVar5 = ppVVar3[uVar45];
        iVar39 = pVVar5->palette_code_bits_;
        iVar11 = (4 << ((byte)iVar39 & 0x1f)) + 0x1138;
        iVar44 = (1 << ((byte)iVar39 & 0x1f)) + 0x118;
        if (iVar39 < 1) {
          iVar44 = 0x118;
        }
        __dest = pVVar5->literal_;
        if (iVar39 < 1) {
          iVar11 = 0x1138;
        }
        memcpy(pVVar5,pVVar4,(long)iVar11);
        pVVar5->literal_ = __dest;
        memcpy(__dest,pVVar4->literal_,(long)iVar44 << 2);
        uVar12 = uVar40;
        uVar40 = uVar40 + 1;
      }
      histogram_symbols[uVar45] = uVar12;
      uVar45 = uVar45 + 1;
    } while ((long)uVar45 < (long)local_160->max_size);
  }
  puVar9 = local_168;
  __s = local_168;
  if ((99 < quality) ||
     (iVar39 = (int)local_158 * 2, iVar44 = (int)local_198,
     iVar44 == iVar39 || SBORROW4(iVar44,iVar39) != iVar44 + (int)local_158 * -2 < 0)) {
LAB_00145a9b:
    iVar39 = (int)local_198;
    iVar21 = quality * quality * quality;
    lVar34 = (long)(iVar21 * 99);
    lVar16 = lVar34 + -500000;
    if (-1 < iVar21) {
      lVar16 = lVar34 + 500000;
    }
    uVar22 = SUB168(SEXT816(lVar16) * SEXT816(0x431bde82d7b634db),8);
    uVar45 = uVar22 >> 0x3f;
    iVar21 = (int)(uVar22 >> 0x12);
    iVar44 = SUB164(SEXT816(lVar16) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f;
    iVar11 = iVar21 - iVar44;
    local_158 = CONCAT44(local_158._4_4_,iVar11);
    if (iVar11 < iVar39) {
      ppVVar2 = image_histo->histograms;
      __base = WebPSafeMalloc((long)iVar39,4);
      if (__base != (void *)0x0) {
        local_178.size = 0;
        local_178.max_size = 9;
        pHVar17 = (HistogramPair *)WebPSafeMalloc(10,0x18);
        local_178.queue = pHVar17;
        if (pHVar17 == (HistogramPair *)0x0) {
          pHVar30 = (HistogramPair *)0x0;
        }
        else {
          iVar11 = image_histo->size;
          if (0 < iVar11) {
            lVar16 = 0;
            iVar71 = 0;
            do {
              if (ppVVar2[lVar16] != (VP8LHistogram *)0x0) {
                lVar34 = (long)iVar71;
                iVar71 = iVar71 + 1;
                *(int *)((long)__base + lVar34 * 4) = (int)lVar16;
                iVar11 = image_histo->size;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < iVar11);
          }
          iVar21 = (iVar21 - iVar44) + 1;
          if (0 < iVar39) {
            local_150 = CONCAT44(local_150._4_4_,(int)(local_198 >> 0x1f) + iVar39 >> 1);
            uVar45 = 1;
            uVar22 = 0;
            iVar44 = 0;
            iVar11 = 0;
            iVar71 = 0;
            local_144 = iVar21;
            local_140 = pHVar17;
            do {
              iVar21 = (int)local_198;
              if (iVar21 <= (int)local_158) break;
              iVar71 = iVar71 + 1;
              if ((int)local_150 <= iVar71) break;
              if (iVar44 == 0) {
                iVar38 = 0;
              }
              else {
                iVar38 = (local_178.queue)->cost_diff;
              }
              local_184 = 1;
              local_180 = CONCAT44(local_180._4_4_,iVar21 + -1);
              if (1 < iVar21) {
                uVar41 = local_198 >> 1;
                do {
                  uVar25 = (uint)((uVar45 * 0xbc8f) / 0x7fffffff);
                  uVar45 = (ulong)((int)(uVar45 * 0xbc8f) + (uVar25 << 0x1f | uVar25));
                  uVar29 = uVar45 % (ulong)(uint)((iVar21 + -1) * iVar21);
                  uVar22 = uVar29 / (local_180 & 0xffffffff);
                  uVar25 = (uint)(uVar29 % (local_180 & 0xffffffff));
                  iVar18 = HistoQueuePush(&local_178,ppVVar2,*(int *)((long)__base + uVar22 * 4),
                                          *(int *)((long)__base +
                                                  (ulong)((uVar25 + 1) -
                                                         (uint)(uVar25 < (uint)uVar22)) * 4),iVar38)
                  ;
                  uVar22 = local_178._8_8_ & 0xffffffff;
                  iVar44 = local_178.size;
                  if ((iVar18 < 0) && (local_178.size == local_178.max_size)) break;
                  if (iVar18 < 0) {
                    iVar38 = iVar18;
                  }
                  uVar25 = (int)uVar41 - 1;
                  uVar41 = (ulong)uVar25;
                } while (uVar25 != 0);
              }
              pHVar17 = local_178.queue;
              if (iVar44 == 0) {
                iVar44 = 0;
              }
              else {
                uVar25 = (local_178.queue)->idx1;
                local_184 = (local_178.queue)->idx2;
                __dest_00 = bsearch(&local_184,__base,(long)iVar21,4,PairComparison);
                memmove(__dest_00,(void *)((long)__dest_00 + 4),
                        (((ulong)~((long)__dest_00 - (long)__base) >> 2) + (long)iVar21) * 4);
                pVVar4 = ppVVar2[(int)local_184];
                pVVar5 = ppVVar2[(int)uVar25];
                VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
                uVar40 = pVVar4->trivial_symbol_;
                if (uVar40 != pVVar5->trivial_symbol_) {
                  uVar40 = 0xffffffff;
                }
                pVVar5->trivial_symbol_ = uVar40;
                ppVVar2[(int)uVar25]->bit_cost_ = pHVar17->cost_combo;
                image_histo->histograms[(int)local_184] = (VP8LHistogram *)0x0;
                uVar13 = image_histo->size;
                if (0 < (int)uVar13 && uVar13 - 1 == local_184) {
                  do {
                    if (image_histo->histograms[(ulong)uVar13 - 1] != (VP8LHistogram *)0x0) break;
                    image_histo->size = uVar13 - 1;
                    bVar20 = 1 < (int)uVar13;
                    uVar13 = uVar13 - 1;
                  } while (bVar20);
                }
                if (0 < (int)uVar22) {
                  iVar21 = 0;
                  do {
                    pHVar30 = pHVar17 + iVar21;
                    uVar13 = pHVar30->idx1;
                    uVar14 = pHVar30->idx2;
                    iVar44 = (int)uVar22;
                    if ((uVar13 != local_184 && uVar13 != uVar25) ||
                       (uVar14 != local_184 && uVar14 != uVar25)) {
                      if (uVar13 != local_184 && uVar13 != uVar25) {
                        bVar20 = true;
                        if (uVar14 == local_184 || uVar14 == uVar25) {
                          pHVar30->idx2 = uVar25;
                          bVar20 = false;
                          uVar14 = uVar25;
                        }
                      }
                      else {
                        pHVar30->idx1 = uVar25;
                        bVar20 = false;
                        uVar13 = uVar25;
                      }
                      uVar15 = uVar13;
                      if ((int)uVar14 < (int)uVar13) {
                        pHVar30->idx2 = uVar13;
                        pHVar30->idx1 = uVar14;
                        uVar15 = uVar14;
                        uVar14 = uVar13;
                      }
                      if ((!bVar20) &&
                         (iVar71 = HistoQueueUpdatePair
                                             (ppVVar2[(int)uVar15],ppVVar2[(int)uVar14],0,pHVar30),
                         iVar71 == 0)) goto LAB_00145dce;
                      if (pHVar30->cost_diff < pHVar17->cost_diff) {
                        local_138[0].last_pos_ = (PixOrCopy *)pHVar17->cost_combo;
                        local_138[0].cur_pos = *(PixOrCopy **)pHVar17;
                        local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar17->cost_diff;
                        pHVar17->cost_combo = pHVar30->cost_combo;
                        iVar44 = pHVar30->idx2;
                        iVar38 = pHVar30->cost_diff;
                        pHVar17->idx1 = pHVar30->idx1;
                        pHVar17->idx2 = iVar44;
                        pHVar17->cost_diff = iVar38;
                        pHVar30->cost_combo = (uint64_t)local_138[0].last_pos_;
                        *(PixOrCopy **)pHVar30 = local_138[0].cur_pos;
                        pHVar30->cost_diff = (int64_t)local_138[0].cur_block_;
                      }
                      iVar21 = iVar21 + 1;
                    }
                    else {
LAB_00145dce:
                      pHVar30->cost_combo = pHVar17[(long)iVar44 + -1].cost_combo;
                      pHVar1 = pHVar17 + (long)iVar44 + -1;
                      iVar71 = pHVar1->idx2;
                      iVar38 = pHVar1->cost_diff;
                      pHVar30->idx1 = pHVar1->idx1;
                      pHVar30->idx2 = iVar71;
                      pHVar30->cost_diff = iVar38;
                      uVar22 = (ulong)(iVar44 - 1);
                    }
                  } while (iVar21 < (int)uVar22);
                }
                iVar44 = (int)uVar22;
                local_178.size = iVar44;
                iVar71 = 0;
                local_198 = local_180 & 0xffffffff;
              }
              iVar11 = iVar11 + 1;
              __s = local_168;
            } while (iVar11 != iVar39);
            iVar39 = (int)local_198;
            pHVar17 = local_140;
            iVar21 = local_144;
          }
          uVar45 = (ulong)(iVar21 < iVar39);
          pHVar30 = local_178.queue;
        }
        WebPSafeFree(pHVar30);
        WebPSafeFree(__base);
        if (pHVar17 != (HistogramPair *)0x0) {
          if (uVar45 != 0) goto LAB_001461e5;
          goto LAB_00145f4f;
        }
      }
    }
    else {
LAB_00145f4f:
      iVar21 = image_histo->size;
      if ((long)iVar21 < 1) {
        uVar25 = 0;
      }
      else {
        lVar16 = 0;
        uVar25 = 0;
        do {
          pVVar4 = image_histo->histograms[lVar16];
          if (pVVar4 != (VP8LHistogram *)0x0) {
            uVar22 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
            image_histo->histograms[uVar22] = pVVar4;
          }
          lVar16 = lVar16 + 1;
        } while (iVar21 != lVar16);
      }
      image_histo->size = uVar25;
      ppVVar2 = image_histo->histograms;
      local_178._8_8_ = (ulong)(uVar25 * uVar25) << 0x20;
      local_178.queue = (HistogramPair *)WebPSafeMalloc((ulong)(uVar25 * uVar25 + 1),0x18);
      if (local_178.queue != (HistogramPair *)0x0) {
        if (0 < (int)uVar25) {
          uVar45 = (ulong)uVar25;
          uVar41 = 1;
          uVar22 = 0;
          do {
            uVar29 = uVar22 + 1;
            uVar31 = uVar41;
            if (uVar29 < uVar45 && image_histo->histograms[uVar22] != (VP8LHistogram *)0x0) {
              do {
                if (image_histo->histograms[uVar31] != (VP8LHistogram *)0x0) {
                  HistoQueuePush(&local_178,ppVVar2,(int)uVar22,(int)uVar31,0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar45 != uVar31);
            }
            uVar41 = uVar41 + 1;
            uVar22 = uVar29;
          } while (uVar29 != uVar45);
          do {
            iVar21 = local_178.size;
            do {
              pHVar17 = local_178.queue;
              if (iVar21 < 1) goto LAB_001461ce;
              uVar25 = (local_178.queue)->idx1;
              uVar13 = (local_178.queue)->idx2;
              pVVar4 = ppVVar2[(int)uVar13];
              pVVar5 = ppVVar2[(int)uVar25];
              VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
              uVar40 = pVVar4->trivial_symbol_;
              if (uVar40 != pVVar5->trivial_symbol_) {
                uVar40 = 0xffffffff;
              }
              pVVar5->trivial_symbol_ = uVar40;
              ppVVar2[(int)uVar25]->bit_cost_ = pHVar17->cost_combo;
              image_histo->histograms[(int)uVar13] = (VP8LHistogram *)0x0;
              uVar14 = image_histo->size;
              if (0 < (int)uVar14 && uVar14 - 1 == uVar13) {
                do {
                  if (image_histo->histograms[(ulong)uVar14 - 1] != (VP8LHistogram *)0x0) break;
                  image_histo->size = uVar14 - 1;
                  bVar20 = 1 < (int)uVar14;
                  uVar14 = uVar14 - 1;
                } while (bVar20);
              }
              iVar39 = 0;
              do {
                pHVar30 = pHVar17 + iVar39;
                if ((((pHVar30->idx1 == uVar25) || (pHVar30->idx2 == uVar13)) ||
                    (pHVar30->idx1 == uVar13)) || (pHVar30->idx2 == uVar25)) {
                  pHVar30->cost_combo = pHVar17[(long)iVar21 + -1].cost_combo;
                  pHVar1 = pHVar17 + (long)iVar21 + -1;
                  iVar44 = pHVar1->idx2;
                  iVar38 = pHVar1->cost_diff;
                  pHVar30->idx1 = pHVar1->idx1;
                  pHVar30->idx2 = iVar44;
                  pHVar30->cost_diff = iVar38;
                  iVar21 = iVar21 + -1;
                }
                else {
                  if (pHVar30->cost_diff < pHVar17->cost_diff) {
                    local_138[0].last_pos_ = (PixOrCopy *)pHVar17->cost_combo;
                    local_138[0].cur_pos = *(PixOrCopy **)pHVar17;
                    local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar17->cost_diff;
                    pHVar17->cost_combo = pHVar30->cost_combo;
                    iVar44 = pHVar30->idx2;
                    iVar38 = pHVar30->cost_diff;
                    pHVar17->idx1 = pHVar30->idx1;
                    pHVar17->idx2 = iVar44;
                    pHVar17->cost_diff = iVar38;
                    pHVar30->cost_combo = (uint64_t)local_138[0].last_pos_;
                    *(PixOrCopy **)pHVar30 = local_138[0].cur_pos;
                    pHVar30->cost_diff = (int64_t)local_138[0].cur_block_;
                  }
                  iVar39 = iVar39 + 1;
                }
              } while (iVar39 < iVar21);
              local_178.size = iVar21;
              iVar39 = image_histo->size;
            } while (iVar39 < 1);
            uVar22 = 0;
            do {
              if ((uVar25 != uVar22) && (image_histo->histograms[uVar22] != (VP8LHistogram *)0x0)) {
                HistoQueuePush(&local_178,image_histo->histograms,uVar25,(int)uVar22,0);
                iVar39 = image_histo->size;
              }
              uVar22 = uVar22 + 1;
            } while ((long)uVar22 < (long)iVar39);
          } while( true );
        }
LAB_001461ce:
        WebPSafeFree(local_178.queue);
        __s = local_168;
        goto LAB_001461e5;
      }
      WebPSafeFree((void *)0x0);
    }
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto LAB_00146422;
  }
  local_150 = 0x10;
  if (quality < 0x5a) {
    local_150 = (ulong)((((uint)(iVar21 < 0x101) * 8 + 8 >> (0x200 < iVar21)) >> (0x400 < iVar21))
                       >> (quality < 0x33));
  }
  iVar21 = image_histo->size;
  lVar16 = (long)iVar21;
  ppVVar2 = image_histo->histograms;
  if (0 < lVar16) {
    uVar45 = 0xffffffffffffffff;
    lVar34 = 0;
    uVar41 = 0;
    uVar29 = 0;
    uVar31 = 0xffffffffffffffff;
    uVar32 = 0;
    uVar33 = 0xffffffffffffffff;
    do {
      pVVar4 = ppVVar2[lVar34];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        uVar6 = pVVar4->literal_cost_;
        if (uVar41 <= uVar6) {
          uVar41 = uVar6;
        }
        uVar7 = pVVar4->red_cost_;
        if (uVar6 <= uVar45) {
          uVar45 = uVar6;
        }
        if (uVar29 <= uVar7) {
          uVar29 = uVar7;
        }
        if (uVar7 <= uVar31) {
          uVar31 = uVar7;
        }
        uVar6 = pVVar4->blue_cost_;
        if (uVar32 <= uVar6) {
          uVar32 = uVar6;
        }
        if (uVar6 <= uVar33) {
          uVar33 = uVar6;
        }
      }
      lVar34 = lVar34 + 1;
    } while (lVar16 != lVar34);
    lVar34 = uVar41 - uVar45;
    auVar49._8_4_ = (int)((ulong)lVar34 >> 0x20);
    auVar49._0_8_ = lVar34;
    auVar49._12_4_ = 0x45300000;
    lVar35 = uVar29 - uVar31;
    auVar54._8_4_ = (int)((ulong)lVar35 >> 0x20);
    auVar54._0_8_ = lVar35;
    auVar54._12_4_ = 0x45300000;
    lVar36 = uVar32 - uVar33;
    auVar72._8_4_ = (int)((ulong)lVar36 >> 0x20);
    auVar72._0_8_ = lVar36;
    auVar72._12_4_ = 0x45300000;
    lVar37 = 0;
    do {
      pVVar4 = ppVVar2[lVar37];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        uVar43 = 0;
        if (uVar41 != uVar45) {
          lVar23 = pVVar4->literal_cost_ - uVar45;
          auVar73._8_4_ = (int)((ulong)lVar23 >> 0x20);
          auVar73._0_8_ = lVar23;
          auVar73._12_4_ = 0x45300000;
          uVar43 = (ushort)(int)((((auVar73._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)) *
                                 3.999999) /
                                ((auVar49._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar34) - 4503599627370496.0)));
        }
        if ((int)local_180 == 0) {
          sVar24 = 0;
          sVar42 = 0;
          if (uVar29 != uVar31) {
            lVar23 = pVVar4->red_cost_ - uVar31;
            auVar57._8_4_ = (int)((ulong)lVar23 >> 0x20);
            auVar57._0_8_ = lVar23;
            auVar57._12_4_ = 0x45300000;
            sVar42 = (short)((int)((((auVar57._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0))
                                   * 3.999999) /
                                  ((auVar54._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar35) - 4503599627370496.0)))
                            << 2);
          }
          if (uVar32 != uVar33) {
            lVar23 = pVVar4->blue_cost_ - uVar33;
            auVar58._8_4_ = (int)((ulong)lVar23 >> 0x20);
            auVar58._0_8_ = lVar23;
            auVar58._12_4_ = 0x45300000;
            sVar24 = (short)(int)((((auVar58._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0))
                                  * 3.999999) /
                                 ((auVar72._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar36) - 4503599627370496.0)));
          }
          uVar43 = sVar42 + uVar43 * 0x10 + sVar24;
        }
        local_168[lVar37] = uVar43;
      }
      lVar37 = lVar37 + 1;
    } while (lVar16 != lVar37);
  }
  auVar49 = _DAT_001b7040;
  local_1a0 = tmp_histo;
  uVar45 = 0;
  do {
    *(undefined4 *)((long)&local_138[0].cur_pos + uVar45 * 4) = 0xffff;
    uVar45 = uVar45 + 1;
  } while ((local_158 & 0xffffffff) != uVar45);
  local_158 = local_198;
  if (0 < iVar44) {
    lVar16 = local_198 - 1;
    auVar46._8_4_ = (int)lVar16;
    auVar46._0_8_ = lVar16;
    auVar46._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar45 = 0;
    auVar46 = auVar46 ^ _DAT_001b7040;
    auVar53._8_4_ = 0xffffffff;
    auVar53._0_8_ = 0xffffffffffffffff;
    auVar53._12_4_ = 0xffffffff;
    auVar48 = _DAT_001bac30;
    auVar50 = _DAT_001bac40;
    auVar51 = _DAT_001b7030;
    auVar52 = _DAT_001b6e50;
    do {
      auVar54 = auVar52 ^ auVar49;
      iVar39 = auVar46._0_4_;
      iVar67 = -(uint)(iVar39 < auVar54._0_4_);
      iVar11 = auVar46._4_4_;
      auVar55._4_4_ = -(uint)(iVar11 < auVar54._4_4_);
      iVar71 = auVar46._8_4_;
      iVar70 = -(uint)(iVar71 < auVar54._8_4_);
      iVar47 = auVar46._12_4_;
      auVar55._12_4_ = -(uint)(iVar47 < auVar54._12_4_);
      auVar62._4_4_ = iVar67;
      auVar62._0_4_ = iVar67;
      auVar62._8_4_ = iVar70;
      auVar62._12_4_ = iVar70;
      auVar72 = pshuflw(in_XMM11,auVar62,0xe8);
      auVar64._4_4_ = -(uint)(auVar54._4_4_ == iVar11);
      auVar64._12_4_ = -(uint)(auVar54._12_4_ == iVar47);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar73 = pshuflw(in_XMM12,auVar64,0xe8);
      auVar55._0_4_ = auVar55._4_4_;
      auVar55._8_4_ = auVar55._12_4_;
      auVar54 = pshuflw(auVar72,auVar55,0xe8);
      auVar54 = (auVar54 | auVar73 & auVar72) ^ auVar53;
      auVar54 = packssdw(auVar54,auVar54);
      uVar43 = (ushort)uVar45;
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45] = uVar43;
      }
      auVar55 = auVar64 & auVar62 | auVar55;
      auVar54 = packssdw(auVar55,auVar55);
      auVar54 = packssdw(auVar54 ^ auVar53,auVar54 ^ auVar53);
      if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
        local_168[uVar22 + uVar45 + 1] = uVar43 + 1;
      }
      auVar54 = auVar51 ^ auVar49;
      iVar67 = -(uint)(iVar39 < auVar54._0_4_);
      auVar68._4_4_ = -(uint)(iVar11 < auVar54._4_4_);
      iVar70 = -(uint)(iVar71 < auVar54._8_4_);
      auVar68._12_4_ = -(uint)(iVar47 < auVar54._12_4_);
      auVar56._4_4_ = iVar67;
      auVar56._0_4_ = iVar67;
      auVar56._8_4_ = iVar70;
      auVar56._12_4_ = iVar70;
      auVar63._4_4_ = -(uint)(auVar54._4_4_ == iVar11);
      auVar63._12_4_ = -(uint)(auVar54._12_4_ == iVar47);
      auVar63._0_4_ = auVar63._4_4_;
      auVar63._8_4_ = auVar63._12_4_;
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar54 = auVar63 & auVar56 | auVar68;
      auVar54 = packssdw(auVar54,auVar54);
      auVar54 = packssdw(auVar54 ^ auVar53,auVar54 ^ auVar53);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 2] = uVar43 + 2;
      }
      auVar57 = pshufhw(auVar56,auVar56,0x84);
      auVar64 = pshufhw(auVar63,auVar63,0x84);
      auVar58 = pshufhw(auVar57,auVar68,0x84);
      auVar57 = (auVar58 | auVar64 & auVar57) ^ auVar53;
      auVar57 = packssdw(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 3] = uVar43 + 3;
      }
      auVar57 = auVar50 ^ auVar49;
      iVar67 = -(uint)(iVar39 < auVar57._0_4_);
      auVar60._4_4_ = -(uint)(iVar11 < auVar57._4_4_);
      iVar70 = -(uint)(iVar71 < auVar57._8_4_);
      auVar60._12_4_ = -(uint)(iVar47 < auVar57._12_4_);
      auVar65._4_4_ = iVar67;
      auVar65._0_4_ = iVar67;
      auVar65._8_4_ = iVar70;
      auVar65._12_4_ = iVar70;
      auVar54 = pshuflw(auVar54,auVar65,0xe8);
      auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar11);
      auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar47);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      in_XMM12 = pshuflw(auVar73 & auVar72,auVar59,0xe8);
      in_XMM12 = in_XMM12 & auVar54;
      auVar60._0_4_ = auVar60._4_4_;
      auVar60._8_4_ = auVar60._12_4_;
      auVar54 = pshuflw(auVar54,auVar60,0xe8);
      auVar54 = (auVar54 | in_XMM12) ^ auVar53;
      auVar54 = packssdw(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 4] = uVar43 + 4;
      }
      auVar60 = auVar59 & auVar65 | auVar60;
      auVar54 = packssdw(auVar60,auVar60);
      auVar54 = packssdw(auVar54 ^ auVar53,auVar54 ^ auVar53);
      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 5] = uVar43 + 5;
      }
      auVar54 = auVar48 ^ auVar49;
      iVar39 = -(uint)(iVar39 < auVar54._0_4_);
      auVar69._4_4_ = -(uint)(iVar11 < auVar54._4_4_);
      iVar71 = -(uint)(iVar71 < auVar54._8_4_);
      auVar69._12_4_ = -(uint)(iVar47 < auVar54._12_4_);
      auVar61._4_4_ = iVar39;
      auVar61._0_4_ = iVar39;
      auVar61._8_4_ = iVar71;
      auVar61._12_4_ = iVar71;
      auVar66._4_4_ = -(uint)(auVar54._4_4_ == iVar11);
      auVar66._12_4_ = -(uint)(auVar54._12_4_ == iVar47);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar69._0_4_ = auVar69._4_4_;
      auVar69._8_4_ = auVar69._12_4_;
      auVar54 = auVar66 & auVar61 | auVar69;
      auVar54 = packssdw(auVar54,auVar54);
      in_XMM11 = packssdw(auVar54 ^ auVar53,auVar54 ^ auVar53);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 6] = uVar43 + 6;
      }
      auVar54 = pshufhw(auVar61,auVar61,0x84);
      auVar73 = pshufhw(auVar66,auVar66,0x84);
      auVar72 = pshufhw(auVar54,auVar69,0x84);
      auVar54 = (auVar72 | auVar73 & auVar54) ^ auVar53;
      auVar54 = packssdw(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_168[uVar22 + uVar45 + 7] = uVar43 + 7;
      }
      uVar45 = uVar45 + 8;
      lVar16 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + 8;
      auVar52._8_8_ = lVar16 + 8;
      lVar16 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + 8;
      auVar51._8_8_ = lVar16 + 8;
      lVar16 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + 8;
      auVar50._8_8_ = lVar16 + 8;
      lVar16 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 8;
      auVar48._8_8_ = lVar16 + 8;
    } while ((iVar44 + 7U & 0xfffffff8) != uVar45);
  }
  if (0 < iVar21) {
    lVar16 = 0;
    do {
      pVVar4 = ppVVar2[lVar16];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        uVar45 = (ulong)local_168[lVar16];
        lVar34 = (long)*(short *)((long)&local_138[0].cur_pos + uVar45 * 4);
        if (lVar34 == -1) {
          *(short *)((long)&local_138[0].cur_pos + uVar45 * 4) = (short)lVar16;
        }
        else {
          iVar21 = (int)lVar16;
          if ((int)local_180 == 0) {
            lVar36 = pVVar4->bit_cost_ * local_150;
            lVar35 = lVar36 + 0x32;
            if (lVar36 < 0) {
              lVar35 = lVar36 + -0x32;
            }
            lVar36 = SUB168(SEXT816(lVar35) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar35;
            pVVar5 = ppVVar2[lVar34];
            lVar26 = pVVar4->bit_cost_ + pVVar5->bit_cost_;
            lVar23 = (lVar36 >> 6) - (lVar36 >> 0x3f);
            lVar37 = lVar23 + lVar26;
            lVar36 = lVar37;
            if (0x7fffffffffffffff - lVar23 < lVar26) {
              lVar36 = 0x7fffffffffffffff;
            }
            if (lVar35 < 100) {
              lVar37 = lVar36;
            }
            iVar39 = GetCombinedHistogramEntropy(pVVar5,pVVar4,lVar37,(uint64_t *)&local_178);
            if (iVar39 != 0) {
              VP8LHistogramAdd(pVVar5,pVVar4,local_1a0);
              uVar40 = pVVar5->trivial_symbol_;
              if (uVar40 != pVVar4->trivial_symbol_) {
                uVar40 = 0xffffffff;
              }
              local_1a0->trivial_symbol_ = uVar40;
              local_1a0->bit_cost_ = (uint64_t)local_178.queue;
              local_1a0->palette_code_bits_ = pVVar5->palette_code_bits_;
              if ((uVar40 == 0xffffffff) &&
                 (((ppVVar2[lVar16]->trivial_symbol_ != 0xffffffff ||
                   (ppVVar2[lVar34]->trivial_symbol_ != 0xffffffff)) &&
                  (uVar43 = *(ushort *)((long)&local_138[0].cur_pos + uVar45 * 4 + 2), uVar43 < 0x20
                  )))) {
                *(ushort *)((long)&local_138[0].cur_pos + uVar45 * 4 + 2) = uVar43 + 1;
              }
              else {
                pVVar4 = ppVVar2[lVar34];
                ppVVar2[lVar34] = local_1a0;
                image_histo->histograms[iVar21] = (VP8LHistogram *)0x0;
                uVar25 = image_histo->size;
                if (0 < (int)uVar25 && uVar25 - 1 == iVar21) {
                  do {
                    if (image_histo->histograms[(ulong)uVar25 - 1] != (VP8LHistogram *)0x0) break;
                    image_histo->size = uVar25 - 1;
                    bVar20 = 1 < (int)uVar25;
                    uVar25 = uVar25 - 1;
                  } while (bVar20);
                }
                local_198 = (ulong)((int)local_198 - 1);
                puVar9[uVar22 + histogram_symbols[lVar16]] = (ushort)histogram_symbols[lVar34];
                local_1a0 = pVVar4;
              }
            }
          }
          else {
            pVVar5 = ppVVar2[lVar34];
            VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
            uVar40 = pVVar4->trivial_symbol_;
            if (uVar40 != pVVar5->trivial_symbol_) {
              uVar40 = 0xffffffff;
            }
            pVVar5->trivial_symbol_ = uVar40;
            image_histo->histograms[iVar21] = (VP8LHistogram *)0x0;
            uVar25 = image_histo->size;
            if (0 < (int)uVar25 && uVar25 - 1 == iVar21) {
              do {
                if (image_histo->histograms[(ulong)uVar25 - 1] != (VP8LHistogram *)0x0) break;
                image_histo->size = uVar25 - 1;
                bVar20 = 1 < (int)uVar25;
                uVar25 = uVar25 - 1;
              } while (bVar20);
            }
            local_198 = (ulong)((int)local_198 - 1);
            puVar9[uVar22 + histogram_symbols[lVar16]] = (ushort)histogram_symbols[lVar34];
          }
        }
      }
      __s = local_168;
      lVar16 = lVar16 + 1;
      uVar45 = (ulong)image_histo->size;
    } while (lVar16 < (long)uVar45);
    if (0 < image_histo->size && (int)local_180 != 0) {
      lVar16 = 0;
      do {
        if (ppVVar2[lVar16] != (VP8LHistogram *)0x0) {
          UpdateHistogramCost(ppVVar2[lVar16]);
          uVar45 = (ulong)(uint)image_histo->size;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar45);
    }
  }
  uVar45 = 0;
  bVar20 = false;
  do {
    do {
      bVar8 = bVar20;
      uVar43 = puVar9[uVar22 + uVar45];
      uVar28 = puVar9[uVar22 + uVar43];
      if (uVar43 != uVar28) {
        puVar27 = puVar9 + uVar22 + uVar43;
        do {
          uVar43 = puVar9[uVar22 + uVar28];
          *puVar27 = uVar43;
          puVar27 = puVar9 + uVar22 + uVar43;
          uVar28 = *puVar27;
        } while (uVar43 != uVar28);
        if (uVar43 != puVar9[uVar22 + uVar45]) {
          puVar9[uVar22 + uVar45] = uVar43;
          bVar8 = true;
        }
      }
      uVar45 = uVar45 + 1;
      bVar20 = bVar8;
    } while (uVar45 != local_158);
    uVar45 = 0;
    bVar20 = false;
  } while (bVar8);
  memset(__s,0,(long)image_histo->max_size * 2);
  uVar25 = image_histo->max_size;
  if (uVar25 != 0) {
    uVar45 = 0;
    uVar43 = 0;
    do {
      if ((ulong)histogram_symbols[uVar45] != 0xffffffff) {
        uVar41 = (ulong)puVar9[uVar22 + histogram_symbols[uVar45]];
        if (uVar41 == 0) {
          uVar28 = *__s;
        }
        else {
          uVar28 = __s[uVar41];
          if (uVar28 == 0) {
            uVar28 = uVar43 + 1;
            __s[uVar41] = uVar28;
            uVar43 = uVar28;
          }
        }
        histogram_symbols[uVar45] = (uint)uVar28;
        uVar25 = image_histo->max_size;
      }
      uVar45 = uVar45 + 1;
    } while (uVar45 < uVar25);
  }
  if ((int)local_180 == 0) goto LAB_00145a9b;
LAB_001461e5:
  iVar21 = image_histo->size;
  if ((long)iVar21 < 1) {
    image_histo->size = 0;
    uVar22 = (ulong)(uint)image_histo->max_size;
    iVar39 = 0;
    if (image_histo->max_size < 1) goto LAB_001463d6;
    local_1a8 = local_160->histograms;
    local_1a0 = (VP8LHistogram *)image_histo->histograms;
    iVar39 = 0;
LAB_0014634e:
    memset(histogram_symbols,0,uVar22 * 4);
LAB_00146370:
    VP8LHistogramSetClear(image_histo);
    image_histo->size = iVar39;
    uVar45 = 0;
    do {
      pVVar4 = local_1a8[uVar45];
      if (pVVar4 != (VP8LHistogram *)0x0) {
        pVVar5 = *(VP8LHistogram **)((long)local_1a0 + (long)(int)histogram_symbols[uVar45] * 8);
        VP8LHistogramAdd(pVVar4,pVVar5,pVVar5);
        uVar40 = pVVar4->trivial_symbol_;
        if (uVar40 != pVVar5->trivial_symbol_) {
          uVar40 = 0xffffffff;
        }
        pVVar5->trivial_symbol_ = uVar40;
      }
      uVar45 = uVar45 + 1;
    } while (uVar22 != uVar45);
  }
  else {
    lVar16 = 0;
    uVar22 = 0;
    do {
      pVVar4 = image_histo->histograms[lVar16];
      uVar45 = uVar22;
      if (pVVar4 != (VP8LHistogram *)0x0) {
        uVar45 = (ulong)((int)uVar22 + 1);
        image_histo->histograms[uVar22] = pVVar4;
      }
      iVar39 = (int)uVar45;
      lVar16 = lVar16 + 1;
      uVar22 = uVar45;
    } while (iVar21 != lVar16);
    image_histo->size = iVar39;
    local_1a8 = local_160->histograms;
    local_1a0 = (VP8LHistogram *)image_histo->histograms;
    uVar25 = image_histo->max_size;
    uVar22 = (ulong)uVar25;
    if (iVar39 < 2) {
      if (0 < (int)uVar25) goto LAB_0014634e;
    }
    else if (0 < (int)uVar25) {
      uVar41 = 0;
      local_180 = uVar45;
      do {
        if (local_1a8[uVar41] == (VP8LHistogram *)0x0) {
          histogram_symbols[uVar41] = histogram_symbols[uVar41 - 1];
        }
        else {
          uVar45 = 0;
          lVar16 = 0x7fffffffffffffff;
          uVar29 = 0;
          do {
            pVVar4 = *(VP8LHistogram **)((long)local_1a0 + uVar45 * 8);
            lVar34 = pVVar4->bit_cost_ + lVar16;
            lVar35 = lVar34;
            if (0x7fffffffffffffff - lVar16 < (long)pVVar4->bit_cost_) {
              lVar35 = 0x7fffffffffffffff;
            }
            if (lVar16 < 0) {
              lVar35 = lVar34;
            }
            iVar21 = GetCombinedHistogramEntropy
                               (pVVar4,local_1a8[uVar41],lVar35,(uint64_t *)local_138);
            if (iVar21 != 0) {
              lVar16 = (long)local_138[0].cur_pos - pVVar4->bit_cost_;
              uVar29 = uVar45 & 0xffffffff;
            }
            uVar45 = uVar45 + 1;
          } while (local_180 != uVar45);
          histogram_symbols[uVar41] = (uint32_t)uVar29;
          __s = local_168;
        }
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar22);
      goto LAB_00146370;
    }
LAB_001463d6:
    VP8LHistogramSetClear(image_histo);
    image_histo->size = iVar39;
  }
  WebPReportProgress(pic,percent_range + *percent,percent);
LAB_00146422:
  WebPSafeFree(local_160);
  WebPSafeFree(__s);
  return (int)(pic->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      (uint16_t*)WebPSafeMalloc(2 * image_histo_raw_size, sizeof(*map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(
        image_histo, &num_used, histogram_symbols, cluster_mappings, tmp_histo,
        bin_map, entropy_combine_num_bins, combine_cost_factor, low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return (pic->error_code == VP8_ENC_OK);
}